

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

void CountRec(ON_RTreeNode *a_node,int *a_count)

{
  long lVar1;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar2;
  
  if (a_node->m_level < 1) {
    *a_count = *a_count + a_node->m_count;
  }
  else if (0 < a_node->m_count) {
    paVar2 = &a_node->m_branch[0].field_1;
    lVar1 = 0;
    do {
      CountRec(paVar2->m_child,a_count);
      lVar1 = lVar1 + 1;
      paVar2 = paVar2 + 7;
    } while (lVar1 < a_node->m_count);
  }
  return;
}

Assistant:

static void CountRec(ON_RTreeNode* a_node, int& a_count)
{
  if(a_node->IsInternalNode())  // not a leaf node
  {
    for(int index = 0; index < a_node->m_count; ++index)
    {
      CountRec(a_node->m_branch[index].m_child, a_count);
    }
  }
  else // A leaf node
  {
    a_count += a_node->m_count;
  }
}